

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O0

int __thiscall protozero::pbf_reader::get_svarint<int>(pbf_reader *this)

{
  bool bVar1;
  assert_error *this_00;
  uint64_t value;
  int64_t iVar2;
  pbf_reader *this_local;
  
  bVar1 = has_wire_type(this,varint);
  if (!bVar1) {
    bVar1 = has_wire_type(this,length_delimited);
    if (!bVar1) {
      this_00 = (assert_error *)__cxa_allocate_exception(0x10);
      assert_error::assert_error
                (this_00,
                 "(has_wire_type(pbf_wire_type::varint) || has_wire_type(pbf_wire_type::length_delimited)) && \"not a varint\""
                );
      __cxa_throw(this_00,&assert_error::typeinfo,assert_error::~assert_error);
    }
  }
  value = decode_varint(&this->m_data,this->m_end);
  iVar2 = decode_zigzag64(value);
  return (int)iVar2;
}

Assistant:

T get_svarint() {
        protozero_assert((has_wire_type(pbf_wire_type::varint) || has_wire_type(pbf_wire_type::length_delimited)) && "not a varint");
        return static_cast<T>(decode_zigzag64(decode_varint(&m_data, m_end)));
    }